

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_scalar_split(secp256k1_scalar *full)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  secp256k1_context *psVar4;
  int iVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  size_t sVar6;
  long lVar7;
  secp256k1_pubkey *message;
  int extraout_EDX;
  size_t n_pubkeys;
  secp256k1_scalar *extraout_RDX;
  secp256k1_scalar *psVar8;
  secp256k1_scalar *psVar9;
  secp256k1_scalar *seckey;
  uint uVar10;
  undefined1 *puVar11;
  uchar *p2;
  secp256k1_ge *ge;
  secp256k1_scalar *sigs;
  secp256k1_ge *psVar12;
  secp256k1_context *psVar13;
  ulong uVar14;
  ulong uVar15;
  int *recid;
  byte bVar16;
  secp256k1_ge *pubkey;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  secp256k1_ge *psVar17;
  uint uVar18;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  secp256k1_scalar sStack_338;
  secp256k1_ge *psStack_310;
  secp256k1_ge *psStack_308;
  secp256k1_context *psStack_300;
  secp256k1_ge *psStack_2f8;
  code *pcStack_2f0;
  secp256k1_pubkey *apsStack_2e8 [5];
  undefined1 *puStack_2c0;
  secp256k1_ge *psStack_2b8;
  char cStack_2a9;
  undefined8 uStack_2a8;
  undefined1 auStack_2a0 [65];
  byte abStack_25f [7];
  secp256k1_ge *psStack_258;
  uint64_t uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  size_t sStack_210;
  int iStack_208;
  uint uStack_204;
  secp256k1_ge *psStack_200;
  ulong uStack_1f8;
  undefined1 auStack_1f0 [105];
  undefined8 uStack_187;
  uint64_t uStack_17f;
  uint64_t uStack_177;
  secp256k1_ge sStack_160;
  secp256k1_scalar *psStack_f8;
  secp256k1_scalar *psStack_f0;
  byte local_c8 [32];
  byte local_a8 [40];
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  secp256k1_scalar local_40;
  
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  secp256k1_scalar_split_lambda(&local_60,&local_80,full);
  psVar9 = &local_40;
  secp256k1_scalar_mul(psVar9,&secp256k1_const_lambda,&local_80);
  psVar8 = psVar9;
  secp256k1_scalar_add(psVar9,psVar9,&local_60);
  uVar10 = (uint)psVar8;
  secp256k1_scalar_verify(psVar9);
  psVar12 = (secp256k1_ge *)full;
  secp256k1_scalar_verify(full);
  if ((((local_40.d[0] == full->d[0]) && (local_40.d[1] == full->d[1])) &&
      (local_40.d[2] == full->d[2])) && (local_40.d[3] == full->d[3])) {
    iVar5 = secp256k1_scalar_is_high(&local_60);
    if (iVar5 != 0) {
      secp256k1_scalar_negate(&local_60,&local_60);
    }
    iVar5 = secp256k1_scalar_is_high(&local_80);
    if (iVar5 != 0) {
      secp256k1_scalar_negate(&local_80,&local_80);
    }
    secp256k1_scalar_get_b32(local_c8,&local_60);
    lVar7 = 0;
    uVar14 = extraout_RAX;
    do {
      uVar15 = uVar14 & 0xffffffff;
      bVar16 = local_a8[lVar7];
      uVar10 = (uint)bVar16;
      bVar1 = local_c8[lVar7];
      psVar12 = (secp256k1_ge *)(ulong)bVar1;
      uVar14 = (ulong)((uint)bVar16 - (uint)bVar1);
      if (bVar16 == bVar1) {
        uVar14 = uVar15;
      }
      iVar5 = (int)uVar14;
      if (bVar16 != bVar1) goto LAB_00150fca;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    iVar5 = 0;
LAB_00150fca:
    if (iVar5 == 0) {
      secp256k1_scalar_get_b32(local_c8,&local_80);
      lVar7 = 0;
      uVar14 = extraout_RAX_00;
      do {
        uVar15 = uVar14 & 0xffffffff;
        bVar16 = local_a8[lVar7];
        uVar10 = (uint)bVar16;
        bVar1 = local_c8[lVar7];
        psVar12 = (secp256k1_ge *)(ulong)bVar1;
        uVar14 = (ulong)((uint)bVar16 - (uint)bVar1);
        if (bVar16 == bVar1) {
          uVar14 = uVar15;
        }
        iVar5 = (int)uVar14;
        if (bVar16 != bVar1) goto LAB_00150fff;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      iVar5 = 0;
LAB_00150fff:
      if (iVar5 == 0) {
        return;
      }
      goto LAB_0015101c;
    }
  }
  else {
    test_scalar_split_cold_3();
  }
  test_scalar_split_cold_1();
LAB_0015101c:
  test_scalar_split_cold_2();
  sStack_210 = 3;
  auStack_2a0._56_4_ = uVar10;
  iStack_208 = extraout_EDX;
  psStack_200 = psVar12;
  psStack_f8 = full;
  psStack_f0 = psVar9;
LAB_00151054:
  auStack_1f0._65_8_ = (psVar12->x).n[0];
  auStack_1f0._73_8_ = (psVar12->x).n[1];
  auStack_1f0._81_8_ = (psVar12->x).n[2];
  auStack_1f0._89_8_ = (psVar12->x).n[3];
  auStack_1f0._97_8_ = (psVar12->x).n[4];
  uStack_187._0_4_ = (psVar12->x).magnitude;
  uStack_187._4_4_ = (psVar12->x).normalized;
  uStack_17f = (psVar12->y).n[0];
  uStack_177 = (psVar12->y).n[1];
  cStack_2a9 = auStack_2a0._56_4_ != 0 && sStack_210 == 0x21;
  uStack_204 = (uint)(sStack_210 == 0x41) * 4;
  uStack_1f8 = (ulong)(sStack_210 == 0x41 || sStack_210 == 0x21);
  puVar11 = (undefined1 *)0x0;
  while( true ) {
    output = (secp256k1_ge *)(auStack_2a0 + 0x40);
    auStack_1f0[0x40] = (char)puVar11;
    uVar10 = (uint)puVar11;
    uVar18 = *(uchar *)((long)(psVar12->y).n + 0xf) & 1 | 2;
    output_00 = (secp256k1_ge *)(ulong)uVar18;
    if ((auStack_2a0._56_4_ == 0 || iStack_208 == 0) || (uVar10 & 4) != uStack_204) {
      pubkey = (secp256k1_ge *)0x0;
    }
    else {
      pubkey = (secp256k1_ge *)
               CONCAT71((int7)((ulong)psVar9 >> 8),
                        ((uVar10 & 0xfb) == uVar18 || uVar10 == 4) & (byte)uStack_1f8);
    }
    bVar16 = (byte)pubkey;
    psVar13 = CTX;
    if (((cStack_2a9 != '\0' && (uVar10 & 0xfe) == 2) | bVar16) != 1) break;
    auStack_1f0._0_8_ = 0;
    auStack_1f0._8_8_ = 0;
    auStack_1f0._16_8_ = 0;
    auStack_1f0._24_8_ = 0;
    auStack_1f0._32_8_ = 0;
    auStack_1f0._40_4_ = 0;
    auStack_1f0._44_4_ = 0;
    auStack_1f0._48_8_ = 0;
    auStack_1f0._56_8_ = 0;
    stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    uStack_250 = 0x40;
    uStack_248._0_4_ = 0;
    uStack_248._4_4_ = 0;
    uStack_240._0_4_ = 0;
    uStack_240._4_4_ = 0;
    uStack_238 = 0;
    auStack_2a0._0_8_ = 0;
    psStack_2b8 = (secp256k1_ge *)0x15122c;
    ge = (secp256k1_ge *)auStack_1f0;
    psStack_258 = (secp256k1_ge *)auStack_1f0;
    iVar5 = secp256k1_ec_pubkey_parse
                      (CTX,(secp256k1_pubkey *)auStack_1f0,auStack_1f0 + 0x40,sStack_210);
    psVar12 = (secp256k1_ge *)auStack_1f0;
    if (iVar5 == 0) {
LAB_00151770:
      psStack_2b8 = (secp256k1_ge *)0x151775;
      ec_pubkey_parse_pointtest_cold_14();
      psVar17 = psVar12;
LAB_00151775:
      psStack_2b8 = (secp256k1_ge *)0x15177a;
      ec_pubkey_parse_pointtest_cold_13();
      psVar12 = psVar17;
LAB_0015177a:
      psStack_2b8 = (secp256k1_ge *)0x15177f;
      ec_pubkey_parse_pointtest_cold_2();
      goto LAB_0015177f;
    }
    stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430005;
    uStack_250 = 0x40;
    uStack_248._0_4_ = 0;
    uStack_248._4_4_ = 0;
    uStack_240._0_4_ = 0;
    uStack_240._4_4_ = 0;
    uStack_238 = 0;
    auStack_2a0._48_8_ = 0x41;
    auStack_2a0._0_8_ = 0x4d430001;
    auStack_2a0._16_8_ = 0x41;
    auStack_2a0._24_8_ = 0;
    auStack_2a0._32_8_ = 0;
    auStack_2a0._40_4_ = 0;
    auStack_2a0._44_4_ = 0;
    puVar11 = auStack_2a0;
    uStack_2a8 = 0;
    uVar14 = 0x102;
    psStack_2b8 = (secp256k1_ge *)0x1512f0;
    ge = output;
    psVar13 = CTX;
    auStack_2a0._8_8_ = output;
    auStack_2a0._60_4_ = uVar10;
    psStack_258 = (secp256k1_ge *)auStack_1f0;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,(uchar *)output,(size_t *)(auStack_2a0 + 0x30),
                       (secp256k1_pubkey *)auStack_1f0,0x102);
    psVar12 = psStack_200;
    psVar17 = (secp256k1_ge *)auStack_1f0;
    if (iVar5 == 0) goto LAB_00151775;
    auStack_2a0._0_8_ = 0x4d430005;
    auStack_2a0._8_8_ = output;
    auStack_2a0._16_8_ = auStack_2a0._48_8_;
    auStack_2a0._24_8_ = 0;
    auStack_2a0._32_8_ = 0;
    auStack_2a0._40_4_ = 0;
    auStack_2a0._44_4_ = 0;
    uVar15 = (ulong)((long)psVar13 << 3) >> 0x33;
    uVar3 = (((long)psVar13 << 3 | (ulong)psVar13 >> 0x3d) << 0xd | uVar15) >> 3;
    psVar13 = (secp256k1_context *)(uVar3 << 0x33 | (uVar15 << 0x3d | uVar3) >> 0xd);
    uStack_2a8 = 0;
    if (auStack_2a0._48_8_ != 0x21) goto LAB_00151784;
    lVar7 = 1;
    puVar11 = (undefined1 *)(ulong)(uint)auStack_2a0._60_4_;
    do {
      bVar1 = auStack_2a0[lVar7 + 0x40];
      ge = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = auStack_1f0[lVar7 + 0x40];
      psVar13 = (secp256k1_context *)(ulong)bVar2;
      uVar15 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar15 = uVar14 & 0xffffffff;
      }
      iVar5 = (int)uVar15;
      if (bVar1 != bVar2) goto LAB_00151393;
      lVar7 = lVar7 + 1;
      uVar14 = uVar15;
    } while (lVar7 != 0x21);
    iVar5 = 0;
LAB_00151393:
    if (iVar5 != 0) goto LAB_00151789;
    if ((sStack_210 == 0x21) && (auStack_2a0[0x40] != auStack_1f0[0x40])) goto LAB_0015178e;
    pubkey = (secp256k1_ge *)auStack_1f0;
    if (bVar16 != 0) {
      if (auStack_2a0[0x40] != (char)uVar18) goto LAB_00151793;
      psStack_2b8 = (secp256k1_ge *)0x1513e7;
      ge = &sStack_160;
      psVar13 = CTX;
      iVar5 = secp256k1_pubkey_load(CTX,&sStack_160,(secp256k1_pubkey *)pubkey);
      output = &sStack_160;
      if (iVar5 == 0) goto LAB_00151798;
      auStack_1f0._48_8_ = 0;
      auStack_1f0._56_8_ = 0;
      auStack_1f0._32_8_ = 0;
      auStack_1f0._40_4_ = 0;
      auStack_1f0._44_4_ = 0;
      auStack_1f0._16_8_ = 0;
      auStack_1f0._24_8_ = 0;
      auStack_1f0._0_8_ = 0;
      auStack_1f0._8_8_ = 0;
      auStack_2a0._0_8_ = 0x4d430001;
      auStack_2a0._16_8_ = 0x40;
      auStack_2a0._24_8_ = 0;
      auStack_2a0._32_8_ = 0;
      auStack_2a0._40_4_ = 0;
      auStack_2a0._44_4_ = 0;
      output = (secp256k1_ge *)auStack_2a0;
      uStack_2a8 = 0;
      psStack_2b8 = (secp256k1_ge *)0x15146d;
      auStack_2a0._8_8_ = pubkey;
      secp256k1_pubkey_save((secp256k1_pubkey *)pubkey,&sStack_160);
      auStack_2a0._48_8_ = 0x41;
      auStack_2a0._0_8_ = 0x4d430001;
      output_00 = (secp256k1_ge *)(auStack_2a0 + 0x40);
      auStack_2a0._16_8_ = 0x41;
      auStack_2a0._24_8_ = 0;
      auStack_2a0._32_8_ = 0;
      auStack_2a0._40_4_ = 0;
      auStack_2a0._44_4_ = 0;
      puVar11 = (undefined1 *)0x40;
      uStack_2a8 = 0;
      psStack_2b8 = (secp256k1_ge *)0x15151d;
      ge = output_00;
      psVar13 = CTX;
      auStack_2a0._8_8_ = output_00;
      iVar5 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output_00,(size_t *)(auStack_2a0 + 0x30),
                         (secp256k1_pubkey *)pubkey,2);
      if (iVar5 == 0) goto LAB_0015179d;
      auStack_2a0._0_8_ = 0x4d430005;
      auStack_2a0._8_8_ = output_00;
      auStack_2a0._16_8_ = auStack_2a0._48_8_;
      auStack_2a0._24_8_ = 0;
      auStack_2a0._32_8_ = 0;
      auStack_2a0._40_4_ = 0;
      auStack_2a0._44_4_ = 0;
      uVar14 = (ulong)((long)psVar13 << 3) >> 0x33;
      uVar15 = (((long)psVar13 << 3 | (ulong)psVar13 >> 0x3d) << 0xd | uVar14) >> 3;
      psVar13 = (secp256k1_context *)(uVar15 << 0x33 | (uVar14 << 0x3d | uVar15) >> 0xd);
      puVar11 = (undefined1 *)0x40;
      uStack_2a8 = 0;
      if (auStack_2a0._48_8_ != 0x41) goto LAB_001517a2;
      psVar17 = output_00;
      if (auStack_2a0[0x40] != '\x04') goto LAB_001517a7;
      lVar7 = 0;
      puVar11 = (undefined1 *)(ulong)(uint)auStack_2a0._60_4_;
      do {
        bVar16 = abStack_25f[lVar7];
        ge = (secp256k1_ge *)(ulong)bVar16;
        bVar1 = *(uchar *)((long)(psVar12->x).n + lVar7);
        psVar13 = (secp256k1_context *)(ulong)bVar1;
        iVar5 = (uint)bVar16 - (uint)bVar1;
        if (bVar16 != bVar1) goto LAB_001515bb;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      iVar5 = 0;
LAB_001515bb:
      if (iVar5 == 0) goto LAB_00151726;
      goto LAB_001517ac;
    }
LAB_00151726:
    psVar9 = (secp256k1_scalar *)auStack_1f0;
    uVar10 = (int)puVar11 + 1;
    puVar11 = (undefined1 *)(ulong)uVar10;
    if (uVar10 == 0x100) goto LAB_0015174c;
  }
  auStack_1f0._48_8_ = 0xfefefefefefefefe;
  auStack_1f0._56_8_ = 0xfefefefefefefefe;
  auStack_1f0._32_8_ = 0xfefefefefefefefe;
  auStack_1f0._40_4_ = -0x1010102;
  auStack_1f0._44_4_ = -0x1010102;
  auStack_1f0._16_8_ = 0xfefefefefefefefe;
  auStack_1f0._24_8_ = 0xfefefefefefefefe;
  auStack_1f0._0_8_ = 0xfefefefefefefefe;
  auStack_1f0._8_8_ = 0xfefefefefefefefe;
  stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
  pubkey = (secp256k1_ge *)auStack_1f0;
  uStack_250 = 0x40;
  uStack_248._0_4_ = 0;
  uStack_248._4_4_ = 0;
  uStack_240._0_4_ = 0;
  uStack_240._4_4_ = 0;
  uStack_238 = 0;
  auStack_2a0._0_8_ = 0;
  psStack_2b8 = (secp256k1_ge *)0x151656;
  ge = pubkey;
  psStack_258 = pubkey;
  iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)pubkey,auStack_1f0 + 0x40,sStack_210);
  psVar4 = CTX;
  if (iVar5 != 0) {
    psStack_2b8 = (secp256k1_ge *)0x151770;
    ec_pubkey_parse_pointtest_cold_1();
    goto LAB_00151770;
  }
  uStack_250 = 0x40;
  uStack_248._0_4_ = 0;
  uStack_248._4_4_ = 0;
  uStack_240._0_4_ = 0;
  uStack_240._4_4_ = 0;
  uStack_238 = 0;
  auStack_2a0._0_8_ = 0;
  unique0x10000a51 = (CTX->illegal_callback).fn;
  psStack_258 = (secp256k1_ge *)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) {
    psStack_2b8 = (secp256k1_ge *)0x15174a;
    (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
  }
  else {
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = auStack_2a0;
  }
  ge = &sStack_160;
  psStack_2b8 = (secp256k1_ge *)0x1516fb;
  psVar13 = CTX;
  iVar5 = secp256k1_pubkey_load(CTX,ge,(secp256k1_pubkey *)pubkey);
  psVar4 = CTX;
  if (iVar5 != 0) goto LAB_0015177a;
  (CTX->illegal_callback).fn = stack0xfffffffffffffda0;
  (psVar4->illegal_callback).data = psStack_258;
  if (auStack_2a0._0_4_ == 1) goto LAB_00151726;
LAB_0015177f:
  psStack_2b8 = (secp256k1_ge *)0x151784;
  ec_pubkey_parse_pointtest_cold_3();
  psVar17 = psVar12;
LAB_00151784:
  psVar12 = psVar17;
  psStack_2b8 = (secp256k1_ge *)0x151789;
  ec_pubkey_parse_pointtest_cold_4();
LAB_00151789:
  psStack_2b8 = (secp256k1_ge *)0x15178e;
  ec_pubkey_parse_pointtest_cold_5();
LAB_0015178e:
  psStack_2b8 = (secp256k1_ge *)0x151793;
  ec_pubkey_parse_pointtest_cold_12();
LAB_00151793:
  psStack_2b8 = (secp256k1_ge *)0x151798;
  ec_pubkey_parse_pointtest_cold_6();
LAB_00151798:
  psStack_2b8 = (secp256k1_ge *)0x15179d;
  ec_pubkey_parse_pointtest_cold_11();
LAB_0015179d:
  psStack_2b8 = (secp256k1_ge *)0x1517a2;
  ec_pubkey_parse_pointtest_cold_10();
LAB_001517a2:
  psStack_2b8 = (secp256k1_ge *)0x1517a7;
  ec_pubkey_parse_pointtest_cold_7();
  psVar17 = output_00;
LAB_001517a7:
  output_00 = output;
  psStack_2b8 = (secp256k1_ge *)0x1517ac;
  ec_pubkey_parse_pointtest_cold_8();
LAB_001517ac:
  psStack_2b8 = (secp256k1_ge *)test_sort_helper;
  ec_pubkey_parse_pointtest_cold_9();
  psStack_2b8 = psVar12;
  puStack_2c0 = puVar11;
  if (n_pubkeys != 0) {
    sVar6 = 0;
    do {
      apsStack_2e8[sVar6] =
           (secp256k1_pubkey *)
           ((&(psVar13->ecmult_gen_ctx).scalar_offset)[(ge->x).n[sVar6] * 2 + -1].d + 3);
      sVar6 = sVar6 + 1;
    } while (n_pubkeys != sVar6);
  }
  pcStack_2f0 = (code *)0x1517ee;
  secp256k1_ec_pubkey_sort(CTX,apsStack_2e8,n_pubkeys);
  if (n_pubkeys != 0) {
    sVar6 = 0;
    psVar9 = extraout_RDX;
    do {
      message = apsStack_2e8[sVar6];
      sigs = (secp256k1_scalar *)0x0;
      psVar8 = psVar9;
      do {
        psVar8 = (secp256k1_scalar *)((ulong)psVar8 & 0xffffffff);
        bVar16 = *(byte *)((long)sigs->d + (long)message->data);
        recid = (int *)(ulong)bVar16;
        bVar1 = *(byte *)((long)sigs->d + (long)&psVar13->ecmult_gen_ctx);
        psVar9 = (secp256k1_scalar *)(ulong)((uint)bVar16 - (uint)bVar1);
        if (bVar16 != bVar1) goto LAB_00151820;
        sigs = (secp256k1_scalar *)((long)sigs->d + 1);
      } while (sigs != (secp256k1_scalar *)0x40);
      psVar9 = (secp256k1_scalar *)0x0;
LAB_00151820:
      if ((int)psVar9 != 0) {
        pcStack_2f0 = random_sign;
        test_sort_helper_cold_1();
        pcStack_2f0 = (code *)0x0;
        psStack_310 = pubkey;
        psStack_308 = output_00;
        psStack_300 = psVar13;
        psStack_2f8 = psVar17;
        do {
          testutil_random_scalar_order_test(&sStack_338);
          iVar5 = secp256k1_ecdsa_sig_sign
                            (&CTX->ecmult_gen_ctx,psVar8,sigs,seckey,(secp256k1_scalar *)message,
                             &sStack_338,recid);
        } while (iVar5 == 0);
        return;
      }
      sVar6 = sVar6 + 1;
      psVar13 = (secp256k1_context *)((psVar13->ecmult_gen_ctx).ge_offset.x.n + 3);
    } while (sVar6 != n_pubkeys);
  }
  return;
LAB_0015174c:
  sStack_210 = sStack_210 + 1;
  if (sStack_210 == 0x42) {
    return;
  }
  goto LAB_00151054;
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}